

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int exprIsConst(Expr *p,int initFlag,int iCur)

{
  undefined1 local_48 [8];
  Walker w;
  int iCur_local;
  int initFlag_local;
  Expr *p_local;
  
  w.xSelectCallback2._4_1_ = (byte)initFlag;
  w.pParse = (Parse *)exprNodeIsConstant;
  w.xExprCallback = selectNodeIsConstant;
  w.walkerDepth = iCur;
  w.u.n = iCur;
  w.u._4_4_ = initFlag;
  sqlite3WalkExpr((Walker *)local_48,p);
  return (int)w.xSelectCallback2._4_1_;
}

Assistant:

static int exprIsConst(Expr *p, int initFlag, int iCur){
  Walker w;
  w.eCode = initFlag;
  w.xExprCallback = exprNodeIsConstant;
  w.xSelectCallback = selectNodeIsConstant;
#ifdef SQLITE_DEBUG
  w.xSelectCallback2 = sqlite3SelectWalkAssert2;
#endif
  w.u.iCur = iCur;
  sqlite3WalkExpr(&w, p);
  return w.eCode;
}